

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

string * __thiscall
ki::dml::Field<unsigned_int>::get_value_string_abi_cxx11_
          (string *__return_storage_ptr__,Field<unsigned_int> *this)

{
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Field<ValueT>::get_value_string() const
	{
		std::ostringstream oss;
		oss << m_value;
		return oss.str();
	}